

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::Table(Connection *this,string *schema_name,string *table_name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ClientContext *database_name;
  CatalogException *this_00;
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<duckdb::Relation,_true> sVar3;
  undefined1 local_a1;
  undefined1 local_a0 [8];
  string local_98;
  string local_78;
  string local_50;
  
  paVar1 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_a0 + 8),anon_var_dwarf_6372561 + 9);
  database_name =
       shared_ptr<duckdb::ClientContext,_true>::operator->
                 ((shared_ptr<duckdb::ClientContext,_true> *)schema_name);
  ClientContext::TableInfo
            ((ClientContext *)local_a0,(string *)database_name,(string *)(local_a0 + 8),table_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_a0 != (undefined1  [8])0x0) {
    local_98._M_dataplus._M_p = (pointer)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<duckdb::TableRelation,std::allocator<duckdb::TableRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>&,duckdb::unique_ptr<duckdb::TableDescription,std::default_delete<duckdb::TableDescription>,true>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98._M_string_length,
               (TableRelation **)(local_a0 + 8),(allocator<duckdb::TableRelation> *)&local_a1,
               (shared_ptr<duckdb::ClientContext,_true> *)schema_name,
               (unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
                *)local_a0);
    shared_ptr<duckdb::TableRelation,_true>::shared_ptr
              ((shared_ptr<duckdb::TableRelation,_true> *)&local_78,
               (shared_ptr<duckdb::TableRelation> *)(local_a0 + 8));
    _Var2._M_pi = extraout_RDX;
    if ((element_type *)local_98._M_string_length != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._M_string_length);
      _Var2._M_pi = extraout_RDX_00;
    }
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)local_78._M_dataplus._M_p;
    (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length;
    if ((__uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)
        local_a0 !=
        (__uniq_ptr_impl<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>_>)
        0x0) {
      ::std::default_delete<duckdb::TableDescription>::operator()
                ((default_delete<duckdb::TableDescription> *)local_a0,(TableDescription *)local_a0);
      _Var2._M_pi = extraout_RDX_01;
    }
    sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var2._M_pi;
    sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (shared_ptr<duckdb::Relation,_true>)
           sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (CatalogException *)__cxa_allocate_exception(0x10);
  local_98._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)(local_a0 + 8),"Table %s does not exist!","");
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,anon_var_dwarf_6372561 + 9);
  ParseInfo::QualifierToString(&local_50,&local_78,table_name,in_RCX);
  CatalogException::CatalogException<std::__cxx11::string>
            (this_00,(string *)(local_a0 + 8),&local_50);
  __cxa_throw(this_00,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

shared_ptr<Relation> Connection::Table(const string &schema_name, const string &table_name) {
	auto table_info = TableInfo(INVALID_CATALOG, schema_name, table_name);
	if (!table_info) {
		throw CatalogException("Table %s does not exist!", ParseInfo::QualifierToString("", schema_name, table_name));
	}
	return make_shared_ptr<TableRelation>(context, std::move(table_info));
}